

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

optional<tinyusdz::Animatable<double>_> *
tinyusdz::prim::anon_unknown_0::ConvertToAnimatable<double>
          (optional<tinyusdz::Animatable<double>_> *__return_storage_ptr__,PrimVar *var)

{
  undefined1 uVar1;
  vtable_type *pvVar2;
  pointer pSVar3;
  bool bVar4;
  char cVar5;
  uint32_t uVar6;
  TimeSamples *this;
  long lVar7;
  ulong uVar8;
  Animatable<double> dst;
  optional<double> pv;
  storage_t<double> local_90;
  undefined2 local_88;
  TypedTimeSamples<double> local_80;
  optional<double> local_60;
  storage_t<tinyusdz::Animatable<double>_> *local_50;
  TimeSamples *local_48;
  optional<double> local_40;
  
  local_90 = (storage_t<double>)0x0;
  local_88 = 0;
  local_80._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_80._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_80._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_80._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_80._dirty = false;
  bVar4 = primvar::PrimVar::is_valid(var);
  if (bVar4) {
    if ((var->_blocked == false) &&
       (((pvVar2 = (var->_value).v_.vtable, pvVar2 != (vtable_type *)0x0 &&
         (uVar6 = (*pvVar2->type_id)(), uVar6 == 0)) ||
        ((pvVar2 = (var->_value).v_.vtable, pvVar2 != (vtable_type *)0x0 &&
         (uVar6 = (*pvVar2->type_id)(), uVar6 == 1)))))) {
      cVar5 = '\0';
    }
    else {
      primvar::PrimVar::get_value<double>(&local_60,var);
      cVar5 = local_60.has_value_;
      if (local_60.has_value_ == true) {
        local_90 = local_60.contained;
        local_88 = 1;
      }
    }
    if ((var->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (var->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (cVar5 == '\0') goto LAB_0025964f;
    }
    else {
      uVar1 = __return_storage_ptr__->has_value_;
      if ((var->_ts)._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (var->_ts)._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        this = &var->_ts;
        local_50 = &__return_storage_ptr__->contained;
        lVar7 = 0;
        uVar8 = 0;
        local_48 = this;
        do {
          if ((var->_ts)._dirty == true) {
            tinyusdz::value::TimeSamples::update(this);
          }
          pSVar3 = (this->_samples).
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((&pSVar3->blocked)[lVar7] == true) {
            TypedTimeSamples<double>::add_blocked_sample
                      (&local_80,*(double *)((long)&pSVar3->t + lVar7));
          }
          else {
            tinyusdz::value::Value::get_value<double>
                      (&local_40,(Value *)((long)&(pSVar3->value).v_.storage + lVar7),false);
            bVar4 = local_40.has_value_;
            local_60.has_value_ = local_40.has_value_;
            if (local_40.has_value_ == true) {
              local_60.contained = local_40.contained;
              TypedTimeSamples<double>::add_sample
                        (&local_80,*(double *)((long)&pSVar3->t + lVar7),
                         (double *)&local_60.contained);
            }
            else {
              *(undefined8 *)((long)local_50 + 0x20) = 0;
              *(undefined8 *)((long)local_50 + 0x28) = 0;
              *(undefined8 *)((long)local_50 + 0x10) = 0;
              *(undefined8 *)((long)local_50 + 0x18) = 0;
              *(undefined8 *)local_50 = 0;
              *(undefined8 *)((long)local_50 + 8) = 0;
              uVar1 = false;
            }
            this = local_48;
            if (bVar4 == false) {
              __return_storage_ptr__->has_value_ = (bool)uVar1;
              goto LAB_00259661;
            }
          }
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + 0x28;
        } while (uVar8 < (ulong)(((long)(var->_ts)._samples.
                                        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(var->_ts)._samples.
                                        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                -0x3333333333333333));
      }
      __return_storage_ptr__->has_value_ = (bool)uVar1;
    }
    __return_storage_ptr__->has_value_ = true;
    *(storage_t<double> *)&__return_storage_ptr__->contained = local_90;
    *(undefined2 *)((long)&__return_storage_ptr__->contained + 8) = local_88;
    *(pointer *)((long)&__return_storage_ptr__->contained + 0x10) =
         local_80._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(ulong *)((long)&__return_storage_ptr__->contained + 0x18) =
         CONCAT71(local_80._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                  local_80._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._0_1_);
    *(ulong *)((long)&__return_storage_ptr__->contained + 0x20) =
         CONCAT71(local_80._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                  local_80._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
    local_80._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_80._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_80._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_80._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_80._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    *(bool *)((long)&__return_storage_ptr__->contained + 0x28) = local_80._dirty;
  }
  else {
LAB_0025964f:
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
  }
LAB_00259661:
  if (local_80._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80._samples.
                    super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT71(local_80._samples.
                             super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_80._samples.
                             super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                    (long)local_80._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static nonstd::optional<Animatable<T>> ConvertToAnimatable(const primvar::PrimVar &var)
{
  Animatable<T> dst;

  if (!var.is_valid()) {
    DCOUT("is_valid failed");
    DCOUT("has_value " << var.has_value());
    DCOUT("has_timesamples " << var.has_timesamples());
    return nonstd::nullopt;
  }

  bool ok = false;

  if (var.has_value()) {

    if (auto pv = var.get_value<T>()) {
      dst.set_default(pv.value());

      ok = true;
      //return std::move(dst);
    }
  }

  if (var.has_timesamples()) {
    for (size_t i = 0; i < var.ts_raw().size(); i++) {
      const value::TimeSamples::Sample &s = var.ts_raw().get_samples()[i];

      // Attribute Block?
      if (s.blocked) {
        dst.add_blocked_sample(s.t);
      } else if (auto pv = s.value.get_value<T>()) {
        dst.add_sample(s.t, pv.value());
      } else {
        // Type mismatch
        DCOUT(i << "/" << var.ts_raw().size() << " type mismatch.");
        return nonstd::nullopt;
      }
    }

    ok = true;
  }

  if (ok) {
    return std::move(dst);
  }

  DCOUT("???");
  return nonstd::nullopt;
}